

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paladin.c
# Opt level: O3

void spell_shield_of_faith(int level,int sn,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  char *txt;
  AFFECT_DATA af;
  AFFECT_DATA AStack_88;
  
  if (vo == (void *)0x0) {
    vo = ch;
  }
  bVar1 = is_affected(ch,(int)gsn_shield_of_faith);
  if (((CHAR_DATA *)vo == ch) && (bVar1)) {
    txt = "You are already surrounded by a shield of faith.\n\r";
  }
  else {
    bVar1 = is_affected((CHAR_DATA *)vo,(int)gsn_shield_of_faith);
    if (!bVar1) {
      act("A pearly white barrier flickers into existence around you.",(CHAR_DATA *)vo,(void *)0x0,
          (void *)0x0,3);
      act("A pearly white barrier flickers into existence around $n.",(CHAR_DATA *)vo,(void *)0x0,
          (void *)0x0,0);
      init_affect(&AStack_88);
      AStack_88.level = ch->level;
      AStack_88.type = gsn_shield_of_faith;
      AStack_88.where = 0;
      AStack_88.aftype = 4;
      AStack_88.location = 0;
      AStack_88.modifier = 0;
      AStack_88.duration = AStack_88.level / 3;
      AStack_88.mod_name = 8;
      affect_to_char((CHAR_DATA *)vo,&AStack_88);
      return;
    }
    txt = "They are already surrounded by a shield of faith.\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_shield_of_faith(int level, int sn, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;
	CHAR_DATA *to = (CHAR_DATA *)vo;

	if (to == nullptr)
		to = ch;

	if (is_affected(ch, gsn_shield_of_faith) && ch == to)
	{
		send_to_char("You are already surrounded by a shield of faith.\n\r", ch);
		return;
	}

	if (is_affected(to, gsn_shield_of_faith))
	{
		send_to_char("They are already surrounded by a shield of faith.\n\r", ch);
		return;
	}

	act("A pearly white barrier flickers into existence around you.", to, 0, 0, TO_CHAR);
	act("A pearly white barrier flickers into existence around $n.", to, 0, 0, TO_ROOM);

	init_affect(&af);
	af.level = ch->level;
	af.type = gsn_shield_of_faith;
	af.where = TO_AFFECTS;
	af.aftype = AFT_COMMUNE;
	af.location = APPLY_NONE;
	af.modifier = 0;
	af.duration = ch->level / 3;
	af.mod_name = MOD_PROTECTION;
	affect_to_char(to, &af);
}